

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3WhereSplit(WhereClause *pWC,Expr *pExpr,u8 op)

{
  Expr *p;
  ExprList_item *pEVar1;
  
  p = pExpr;
  do {
    while ((pExpr == (Expr *)0x0 || ((pExpr->flags & 0x82000) == 0))) {
LAB_00193a2f:
      pWC->op = op;
      if (pExpr == (Expr *)0x0) {
        return;
      }
      if (pExpr->op != op) {
        whereClauseInsert(pWC,p,0);
        return;
      }
      sqlite3WhereSplit(pWC,pExpr->pLeft,op);
      pExpr = pExpr->pRight;
      p = pExpr;
    }
    if ((pExpr->flags >> 0x13 & 1) == 0) {
      if (pExpr->op != 'r') goto LAB_00193a2f;
      pEVar1 = (ExprList_item *)&pExpr->pLeft;
    }
    else {
      pEVar1 = ((pExpr->x).pList)->a;
    }
    pExpr = pEVar1->pExpr;
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereSplit(WhereClause *pWC, Expr *pExpr, u8 op){
  Expr *pE2 = sqlite3ExprSkipCollateAndLikely(pExpr);
  pWC->op = op;
  assert( pE2!=0 || pExpr==0 );
  if( pE2==0 ) return;
  if( pE2->op!=op ){
    whereClauseInsert(pWC, pExpr, 0);
  }else{
    sqlite3WhereSplit(pWC, pE2->pLeft, op);
    sqlite3WhereSplit(pWC, pE2->pRight, op);
  }
}